

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

ssize_t fio_read(intptr_t uuid,void *buffer,size_t count)

{
  char *pcVar1;
  undefined1 *puVar2;
  char cVar3;
  undefined1 uVar4;
  int iVar5;
  code *pcVar6;
  fio_data_s *pfVar7;
  int *piVar8;
  long lVar9;
  uint uVar10;
  fio_lock_i ret;
  timespec local_58;
  int local_44;
  long local_40;
  undefined8 local_38;
  
  pfVar7 = fio_data;
  if ((-1 < uuid) && (uVar10 = (uint)((ulong)uuid >> 8), uVar10 < fio_data->capa)) {
    lVar9 = (long)(int)uVar10 * 0xa8;
    if ((*(char *)((long)fio_data + lVar9 + 0x6d) == (char)uuid) &&
       (*(char *)((long)fio_data + lVar9 + 0x6f) != '\0')) {
      if (count == 0) {
        return 0;
      }
      LOCK();
      pcVar1 = (char *)((long)fio_data + lVar9 + 0x6e);
      cVar3 = *pcVar1;
      *pcVar1 = '\x01';
      UNLOCK();
      local_40 = lVar9;
      while (cVar3 != '\0') {
        local_58.tv_sec = 0;
        local_58.tv_nsec = 1;
        nanosleep(&local_58,(timespec *)0x0);
        LOCK();
        pcVar1 = (char *)((long)pfVar7 + lVar9 + 0x6e);
        cVar3 = *pcVar1;
        *pcVar1 = '\x01';
        UNLOCK();
      }
      local_38 = *(undefined8 *)((long)&fio_data[2].workers + local_40);
      pcVar6 = (code *)**(undefined8 **)((long)&fio_data[2].thread_ids.obj + local_40);
      LOCK();
      puVar2 = (undefined1 *)((long)&fio_data[1].thread_ids.obj + local_40 + 6);
      uVar4 = *puVar2;
      *puVar2 = 0;
      UNLOCK();
      local_58.tv_sec = CONCAT71(local_58.tv_sec._1_7_,uVar4);
      piVar8 = __errno_location();
      local_44 = *piVar8;
      do {
        lVar9 = (*pcVar6)(uuid,local_38,buffer,count);
        if (0 < lVar9) {
          if (fio_data->capa <= uVar10) {
            return lVar9;
          }
          if (*(char *)((long)&fio_data[1].thread_ids.obj + local_40 + 5) == (char)uuid) {
            *(__time_t *)((long)&fio_data[1].thread_ids.next + local_40) =
                 (fio_data->last_cycle).tv_sec;
            return lVar9;
          }
          return lVar9;
        }
        if (-1 < lVar9) goto LAB_0012c226;
        iVar5 = *piVar8;
      } while (iVar5 == 4);
      if ((iVar5 == 0x6b) || (iVar5 == 0xb)) {
        *piVar8 = local_44;
        return 0;
      }
LAB_0012c226:
      fio_force_close(uuid);
      return -1;
    }
  }
  piVar8 = __errno_location();
  *piVar8 = 9;
  return -1;
}

Assistant:

ssize_t fio_read(intptr_t uuid, void *buffer, size_t count) {
  if (!uuid_is_valid(uuid) || !uuid_data(uuid).open) {
    errno = EBADF;
    return -1;
  }
  if (count == 0)
    return 0;
  fio_lock(&uuid_data(uuid).sock_lock);
  ssize_t (*rw_read)(intptr_t, void *, void *, size_t) =
      uuid_data(uuid).rw_hooks->read;
  void *udata = uuid_data(uuid).rw_udata;
  fio_unlock(&uuid_data(uuid).sock_lock);
  int old_errno = errno;
  ssize_t ret;
retry_int:
  ret = rw_read(uuid, udata, buffer, count);
  if (ret > 0) {
    fio_touch(uuid);
    return ret;
  }
  if (ret < 0 && errno == EINTR)
    goto retry_int;
  if (ret < 0 &&
      (errno == EWOULDBLOCK || errno == EAGAIN || errno == ENOTCONN)) {
    errno = old_errno;
    return 0;
  }
  fio_force_close(uuid);
  return -1;
}